

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cc
# Opt level: O2

Node * best_node(Node *first,Node *second,long *target)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = first->thevalue - *target;
  uVar2 = -uVar1;
  if (0 < (long)uVar1) {
    uVar2 = uVar1;
  }
  uVar3 = second->thevalue - *target;
  uVar1 = -uVar3;
  if (0 < (long)uVar3) {
    uVar1 = uVar3;
  }
  if ((uVar1 <= uVar2) &&
     ((first->thevalue != second->thevalue ||
      ((second->thesteps).super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>.
       _M_impl._M_node._M_size <=
       (first->thesteps).super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>.
       _M_impl._M_node._M_size)))) {
    first = second;
  }
  return first;
}

Assistant:

Node *best_node(Node *first, Node *second, const long &target)
{
	long fdiff = labs(first->value() - target);
	long sdiff = labs(second->value() - target);

	if (fdiff < sdiff || (first->value() == second->value() &&
			      first->steps().size() < second->steps().size()))
		return first;
	return second;
}